

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_util.h
# Opt level: O0

int bitset_lenrange_cardinality(uint64_t *words,uint32_t start,uint32_t lenminusone)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  uint32_t i;
  int answer;
  uint32_t endword;
  uint32_t firstword;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_4;
  
  local_28 = in_ESI >> 6;
  uVar2 = in_ESI + in_EDX >> 6;
  bVar1 = (byte)in_ESI;
  if (local_28 == uVar2) {
    local_4 = roaring_hamming(*(ulong *)(in_RDI + (ulong)local_28 * 8) &
                              (0xffffffffffffffffU >> (0x3fU - (char)in_EDX & 0x3f)) <<
                              (bVar1 & 0x3f));
  }
  else {
    local_24 = roaring_hamming(*(ulong *)(in_RDI + (ulong)local_28 * 8) & -1L << (bVar1 & 0x3f));
    while (local_28 = local_28 + 1, local_28 < uVar2) {
      iVar3 = roaring_hamming(*(uint64_t *)(in_RDI + (ulong)local_28 * 8));
      local_24 = iVar3 + local_24;
    }
    local_4 = roaring_hamming(*(ulong *)(in_RDI + (ulong)uVar2 * 8) &
                              0xffffffffffffffffU >> ((bVar1 ^ 0xff) - (char)in_EDX & 0x3f));
    local_4 = local_4 + local_24;
  }
  return local_4;
}

Assistant:

static inline int bitset_lenrange_cardinality(const uint64_t *words,
                                              uint32_t start,
                                              uint32_t lenminusone) {
    uint32_t firstword = start / 64;
    uint32_t endword = (start + lenminusone) / 64;
    if (firstword == endword) {
        return roaring_hamming(words[firstword] &
                               ((~UINT64_C(0)) >> ((63 - lenminusone) % 64))
                                   << (start % 64));
    }
    int answer =
        roaring_hamming(words[firstword] & ((~UINT64_C(0)) << (start % 64)));
    for (uint32_t i = firstword + 1; i < endword; i++) {
        answer += roaring_hamming(words[i]);
    }
    answer += roaring_hamming(words[endword] &
                              (~UINT64_C(0)) >>
                                  (((~start + 1) - lenminusone - 1) % 64));
    return answer;
}